

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O3

void __thiscall LowererMD::EmitInsertInt64(LowererMD *this,Opnd *src,uint index,Instr *instr)

{
  Opnd *dstOpnd;
  ThreadContextInfo *pTVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  undefined4 *puVar6;
  IntConstOpnd *src2Opnd;
  Instr *pIVar7;
  undefined4 extraout_var;
  MemRefOpnd *pMVar8;
  
  dstOpnd = instr->m_dst;
  bVar3 = IRType_IsSimd128(dstOpnd->m_type);
  if (bVar3) {
    bVar3 = IRType_IsInt64(src->m_type);
    if (bVar3) goto LAB_00675bb3;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar6 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                     ,0x232,"(dst->IsSimd128() && src->IsInt64())",
                     "dst->IsSimd128() && src->IsInt64()");
  if (!bVar3) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar6 = 0;
LAB_00675bb3:
  BVar4 = AutoSystemInfo::SSE4_1Available(&AutoSystemInfo::Data);
  if (BVar4 != 0) {
    src2Opnd = IR::IntConstOpnd::New((ulong)index,TyInt8,this->m_func,true);
    pIVar7 = IR::Instr::New(PINSRQ,dstOpnd,src,&src2Opnd->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar7);
    return;
  }
  pTVar1 = this->m_func->m_threadContextInfo;
  iVar5 = (*pTVar1->_vptr_ThreadContextInfo[8])(pTVar1,0);
  pMVar8 = IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar5),TyUint64,this->m_func,
                               AddrOpndKindDynamicMisc);
  Lowerer::InsertMove(&pMVar8->super_Opnd,src,instr,true);
  pMVar8 = IR::MemRefOpnd::New(CONCAT44(extraout_var,iVar5),TyFloat64,this->m_func,
                               AddrOpndKindDynamicMisc);
  pIVar7 = IR::Instr::New((ushort)(index == 0) * 2 + MOVHPD,dstOpnd,&pMVar8->super_Opnd,this->m_func
                         );
  IR::Instr::InsertBefore(instr,pIVar7);
  IR::Instr::HoistMemRefAddress(pIVar7,pMVar8,MOV);
  Legalize<false>(pIVar7,false);
  return;
}

Assistant:

void LowererMD::EmitInsertInt64(IR::Opnd* src, uint index, IR::Instr *instr)
{
    IR::Opnd* dst = instr->GetDst();
    Assert(dst->IsSimd128() && src->IsInt64());

    if (AutoSystemInfo::Data.SSE4_1Available())
    {
#ifdef _M_IX86
        index *= 2;
        Int64RegPair srcPair = m_func->FindOrCreateInt64Pair(src);
        instr->InsertBefore(IR::Instr::New(Js::OpCode::PINSRD, dst, srcPair.low, IR::IntConstOpnd::New(index, TyInt8, m_func, true), m_func));
        instr->InsertBefore(IR::Instr::New(Js::OpCode::PINSRD, dst, srcPair.high, IR::IntConstOpnd::New(index + 1, TyInt8, m_func, true), m_func));
#else
        instr->InsertBefore(IR::Instr::New(Js::OpCode::PINSRQ, dst, src, IR::IntConstOpnd::New(index, TyInt8, m_func, true), m_func));
#endif
}
    else
    {
        intptr_t tempSIMD = m_func->GetThreadContextInfo()->GetSimdTempAreaAddr(0);
#ifdef _M_IX86
        Int64RegPair src1Pair = m_func->FindOrCreateInt64Pair(src);
        IR::Opnd* lower = IR::MemRefOpnd::New(tempSIMD, TyMachPtr, m_func);
        m_lowerer->InsertMove(lower, src1Pair.low, instr);
        IR::Opnd* higher = IR::MemRefOpnd::New(tempSIMD + 4, TyMachPtr, m_func);
        m_lowerer->InsertMove(higher, src1Pair.high, instr);
#else
        IR::Opnd* mem = IR::MemRefOpnd::New(tempSIMD, TyMachPtr, m_func);
        m_lowerer->InsertMove(mem, src, instr);
#endif

        IR::MemRefOpnd* tmp = IR::MemRefOpnd::New(tempSIMD, TyFloat64, m_func);
        Js::OpCode opcode = (index) ? Js::OpCode::MOVHPD : Js::OpCode::MOVLPD;
        IR::Instr* newInstr = IR::Instr::New(opcode, dst, tmp, m_func);
        instr->InsertBefore(newInstr);
        newInstr->HoistMemRefAddress(tmp, Js::OpCode::MOV);
        Legalize(newInstr);
    }
}